

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O0

void __thiscall booster::locale::calendar::calendar(calendar *this,calendar *other)

{
  int iVar1;
  abstract_calendar *paVar2;
  undefined4 extraout_var;
  locale *in_RSI;
  locale *in_RDI;
  
  std::locale::locale(in_RDI,in_RSI);
  std::__cxx11::string::string((string *)(in_RDI + 1),(string *)(in_RSI + 1));
  paVar2 = hold_ptr<booster::locale::abstract_calendar>::operator->
                     ((hold_ptr<booster::locale::abstract_calendar> *)(in_RSI + 5));
  iVar1 = (**paVar2->_vptr_abstract_calendar)();
  hold_ptr<booster::locale::abstract_calendar>::hold_ptr
            ((hold_ptr<booster::locale::abstract_calendar> *)(in_RDI + 5),
             (abstract_calendar *)CONCAT44(extraout_var,iVar1));
  return;
}

Assistant:

calendar::calendar(calendar const &other) :
    locale_(other.locale_),
    tz_(other.tz_),
    impl_(other.impl_->clone())
{
}